

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.hpp
# Opt level: O3

void boost::runtime::finalize_arguments(parameters_store *params,arguments_store *args)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  basic_param_ptr param;
  shared_count local_158;
  basic_cstring<const_char> local_150;
  key_type local_140;
  key_type local_130;
  key_type local_120;
  undefined **local_110;
  _Base_ptr local_108;
  iterator local_100;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  missing_req_arg local_d8;
  specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error> local_a0;
  missing_req_arg local_68;
  
  p_Var4 = (params->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(params->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    p_Var1 = &(args->m_arguments)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var2 = p_Var4[1]._M_left;
      local_158.pi_ = (sp_counted_base *)p_Var4[1]._M_right;
      if ((_Base_ptr)local_158.pi_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_158.pi_)->_M_parent =
             *(int *)&((_Base_ptr)local_158.pi_)->_M_parent + 1;
        UNLOCK();
      }
      if (p_Var2 == (_Base_ptr)0x0) goto LAB_0017e9b1;
      local_120.m_begin = (iterator)p_Var2->_M_parent;
      local_120.m_end =
           (iterator)
           ((long)&p_Var2->_M_left->_M_color + (long)&((_Base_ptr)local_120.m_begin)->_M_color);
      cVar3 = std::
              _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
              ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                      *)args,&local_120);
      if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
        if ((p_Var2 == (_Base_ptr)0x0) ||
           ((*(char *)((long)&p_Var2[5]._M_parent + 3) == '\x01' &&
            ((**(code **)(*(long *)p_Var2 + 0x20))(p_Var2,args), p_Var2 == (_Base_ptr)0x0))))
        goto LAB_0017e9b1;
        local_130.m_begin = (iterator)p_Var2->_M_parent;
        local_130.m_end =
             (iterator)
             ((long)&p_Var2->_M_left->_M_color + (long)&((_Base_ptr)local_130.m_begin)->_M_color);
        cVar3 = std::
                _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                        *)args,&local_130);
        if ((_Rb_tree_header *)cVar3._M_node != p_Var1) goto LAB_0017e8be;
        if (p_Var2 == (_Base_ptr)0x0) goto LAB_0017e9b1;
        if (*(char *)&p_Var2[5]._M_parent == '\0') {
          local_108 = p_Var2->_M_parent;
          local_100 = (iterator)((long)&local_108->_M_color + (long)&p_Var2->_M_left->_M_color);
          local_f8._M_p = (pointer)&local_e8;
          local_f0 = 0;
          local_e8._M_local_buf[0] = '\0';
          local_110 = &PTR__param_error_001caf60;
          specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
          operator<<(&local_d8,
                     (specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>
                      *)&local_110,"Missing argument for required parameter ");
          if (p_Var2 != (_Base_ptr)0x0) {
            specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>::
            operator<<((missing_req_arg *)&local_a0,
                       (specific_param_error<boost::runtime::missing_req_arg,boost::runtime::input_error>
                        *)&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var2->_M_parent);
            specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
            operator<<(&local_68,&local_a0,".");
            unit_test::ut_detail::throw_exception<boost::runtime::missing_req_arg>(&local_68);
          }
          goto LAB_0017e9b1;
        }
      }
      else {
LAB_0017e8be:
        if (p_Var2 == (_Base_ptr)0x0) goto LAB_0017e9b1;
      }
      local_140.m_begin = (iterator)p_Var2->_M_parent;
      local_140.m_end =
           (iterator)
           ((long)&p_Var2->_M_left->_M_color + (long)&((_Base_ptr)local_140.m_begin)->_M_color);
      cVar3 = std::
              _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
              ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                      *)args,&local_140);
      if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
        if (p_Var2 == (_Base_ptr)0x0) {
LAB_0017e9b1:
          __assert_fail("px != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                        ,0x2de,
                        "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
                       );
        }
        if (p_Var2[5]._M_left != (_Base_ptr)0x0) {
          local_150.m_begin = (iterator)p_Var2->_M_parent;
          local_150.m_end =
               (iterator)
               ((long)&p_Var2->_M_left->_M_color + (long)&((_Base_ptr)local_150.m_begin)->_M_color);
          function1<void,_boost::unit_test::basic_cstring<const_char>_>::operator()
                    ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)
                     &p_Var2[5]._M_left,&local_150);
        }
      }
      detail::shared_count::~shared_count(&local_158);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return;
}

Assistant:

inline void
finalize_arguments( parameters_store const& params, runtime::arguments_store& args )
{
    BOOST_TEST_FOREACH( parameters_store::storage_type::value_type const&, v, params.all() ) {
        basic_param_ptr param = v.second;

        if( !args.has( param->p_name ) ) {
            if( param->p_has_default_value )
                param->produce_default( args );

            if( !args.has( param->p_name ) ) {
                BOOST_TEST_I_ASSRT( param->p_optional,
                    missing_req_arg( param->p_name ) << "Missing argument for required parameter " << param->p_name << "." );
            }
        }

        if( args.has( param->p_name ) && !!param->p_callback )
            param->p_callback( param->p_name );
    }
}